

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

void __thiscall
CLI::App::_parse_positional
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  pointer pOVar4;
  size_t sVar5;
  Classifer local_9c [3];
  pointer local_90;
  string local_88;
  reference local_58;
  Option_p *opt;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2;
  string positional;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  App *this_local;
  
  positional.field_2._8_8_ = args;
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back(args);
  ::std::__cxx11::string::string((string *)&__range2,(string *)pvVar3);
  __end2 = std::
           vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ::begin(&this->options_);
  opt = (Option_p *)
        std::
        vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ::end(&this->options_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                *)&opt);
    if (!bVar1) {
      if ((this->parent_ == (App *)0x0) || ((this->fallthrough_ & 1U) == 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)positional.field_2._8_8_);
        local_9c[1] = 0;
        ::std::
        vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>
        ::emplace_back<CLI::detail::Classifer,std::__cxx11::string&>
                  ((vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>
                    *)&this->missing_,local_9c + 1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2);
        if ((this->prefix_command_ & 1U) != 0) {
          while (bVar1 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)positional.field_2._8_8_), ((bVar1 ^ 0xffU) & 1) != 0) {
            local_9c[0] = NONE;
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)positional.field_2._8_8_);
            ::std::
            vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>
            ::emplace_back<CLI::detail::Classifer,std::__cxx11::string&>
                      ((vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>
                        *)&this->missing_,local_9c,pvVar3);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)positional.field_2._8_8_);
          }
        }
        local_9c[2] = 0;
      }
      else {
        _parse_positional(this->parent_,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)positional.field_2._8_8_);
        local_9c[2] = 1;
      }
LAB_00117af3:
      ::std::__cxx11::string::~string((string *)&__range2);
      return;
    }
    local_58 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
               ::operator*(&__end2);
    pOVar4 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_58);
    bVar1 = Option::get_positional(pOVar4);
    if (bVar1) {
      pOVar4 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_58)
      ;
      sVar5 = Option::count(pOVar4);
      pOVar4 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_58)
      ;
      iVar2 = Option::get_expected(pOVar4);
      if (iVar2 <= (int)sVar5) {
        pOVar4 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_58);
        iVar2 = Option::get_expected(pOVar4);
        if (-1 < iVar2) goto LAB_001179ef;
      }
      pOVar4 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_58)
      ;
      ::std::__cxx11::string::string((string *)&local_88,(string *)&__range2);
      Option::add_result(pOVar4,&local_88);
      ::std::__cxx11::string::~string((string *)&local_88);
      local_90 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(local_58);
      std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                (&this->parse_order_,&local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)positional.field_2._8_8_);
      local_9c[2] = 1;
      goto LAB_00117af3;
    }
LAB_001179ef:
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void _parse_positional(std::vector<std::string> &args) {

        std::string positional = args.back();
        for(const Option_p &opt : options_) {
            // Eat options, one by one, until done
            if(opt->get_positional() &&
               (static_cast<int>(opt->count()) < opt->get_expected() || opt->get_expected() < 0)) {

                opt->add_result(positional);
                parse_order_.push_back(opt.get());
                args.pop_back();
                return;
            }
        }

        if(parent_ != nullptr && fallthrough_)
            return parent_->_parse_positional(args);
        else {
            args.pop_back();
            missing_.emplace_back(detail::Classifer::NONE, positional);

            if(prefix_command_) {
                while(!args.empty()) {
                    missing_.emplace_back(detail::Classifer::NONE, args.back());
                    args.pop_back();
                }
            }
        }
    }